

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::
CopySourceCodeInfoToTest_CopyTo_DoesNotCopySourceCodeInfo_Test::
~CopySourceCodeInfoToTest_CopyTo_DoesNotCopySourceCodeInfo_Test
          (CopySourceCodeInfoToTest_CopyTo_DoesNotCopySourceCodeInfo_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CopySourceCodeInfoToTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CopySourceCodeInfoToTest_018e91c0;
  DescriptorPool::~DescriptorPool(&(this->super_CopySourceCodeInfoToTest).pool_);
  compiler::SourceTreeDescriptorDatabase::~SourceTreeDescriptorDatabase
            (&(this->super_CopySourceCodeInfoToTest).db_);
  (this->super_CopySourceCodeInfoToTest).source_tree_.super_SourceTree._vptr_SourceTree =
       (_func_int **)&PTR__SingletonSourceTree_018e9038;
  pcVar2 = (this->super_CopySourceCodeInfoToTest).source_tree_.contents_._M_dataplus._M_p;
  paVar1 = &(this->super_CopySourceCodeInfoToTest).source_tree_.contents_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_CopySourceCodeInfoToTest).source_tree_.filename_._M_dataplus._M_p;
  paVar1 = &(this->super_CopySourceCodeInfoToTest).source_tree_.filename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  compiler::SourceTree::~SourceTree
            (&(this->super_CopySourceCodeInfoToTest).source_tree_.super_SourceTree);
  DescriptorPool::ErrorCollector::~ErrorCollector
            (&(this->super_CopySourceCodeInfoToTest).collector_.super_ErrorCollector);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CopySourceCodeInfoToTest, CopyTo_DoesNotCopySourceCodeInfo) {
  const FileDescriptor* file_desc =
      ABSL_DIE_IF_NULL(pool_.FindFileByName("/test/test.proto"));
  FileDescriptorProto file_desc_proto;
  ASSERT_FALSE(file_desc_proto.has_source_code_info());

  file_desc->CopyTo(&file_desc_proto);
  EXPECT_FALSE(file_desc_proto.has_source_code_info());
}